

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

bool __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,CommandLineArgumentsCallbackStructure *cs,char *value)

{
  size_type *psVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  CommandLineArguments *this_00;
  string var;
  allocator local_41;
  string local_40;
  
  if ((cs->Callback == (CallbackType)0x0) ||
     (iVar2 = (*cs->Callback)(cs->Argument,value,cs->CallData), iVar2 != 0)) {
    bVar4 = true;
    if (cs->Variable == (void *)0x0) {
      return true;
    }
    this_00 = (CommandLineArguments *)&local_40;
    std::__cxx11::string::string((string *)this_00,"1",&local_41);
    if (value != (char *)0x0) {
      this_00 = (CommandLineArguments *)&local_40;
      std::__cxx11::string::assign((char *)this_00);
    }
    switch(cs->VariableType) {
    case 1:
      PopulateVariable(this_00,(int *)cs->Variable,&local_40);
      break;
    case 2:
      PopulateVariable(this_00,(bool *)cs->Variable,&local_40);
      break;
    case 3:
      PopulateVariable(this_00,(double *)cs->Variable,&local_40);
      break;
    case 4:
      PopulateVariable(this_00,(char **)cs->Variable,&local_40);
      break;
    case 5:
      std::__cxx11::string::_M_assign((string *)cs->Variable);
      break;
    case 6:
      PopulateVariable(this_00,(vector<int,_std::allocator<int>_> *)cs->Variable,&local_40);
      break;
    case 7:
      PopulateVariable(this_00,(vector<bool,_std::allocator<bool>_> *)cs->Variable,&local_40);
      break;
    case 8:
      PopulateVariable(this_00,(vector<double,_std::allocator<double>_> *)cs->Variable,&local_40);
      break;
    case 9:
      PopulateVariable(this_00,(vector<char_*,_std::allocator<char_*>_> *)cs->Variable,&local_40);
      break;
    case 10:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)cs->Variable,&local_40);
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Got unknown variable type: \"");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,cs->VariableType);
      poVar3 = std::operator<<(poVar3,"\"");
      std::endl<char,std::char_traits<char>>(poVar3);
      psVar1 = &this->Internals->LastArgument;
      *psVar1 = *psVar1 - 1;
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_006b5e71;
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    psVar1 = &this->Internals->LastArgument;
    *psVar1 = *psVar1 - 1;
LAB_006b5e71:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CommandLineArguments::PopulateVariable(
  CommandLineArgumentsCallbackStructure* cs, const char* value)
{
  // Call the callback
  if (cs->Callback) {
    if (!cs->Callback(cs->Argument, value, cs->CallData)) {
      this->Internals->LastArgument--;
      return false;
    }
  }
  CommandLineArguments_DEBUG("Set argument: " << cs->Argument << " to "
                                              << value);
  if (cs->Variable) {
    std::string var = "1";
    if (value) {
      var = value;
    }
    switch (cs->VariableType) {
      case CommandLineArguments::INT_TYPE:
        this->PopulateVariable(static_cast<int*>(cs->Variable), var);
        break;
      case CommandLineArguments::DOUBLE_TYPE:
        this->PopulateVariable(static_cast<double*>(cs->Variable), var);
        break;
      case CommandLineArguments::STRING_TYPE:
        this->PopulateVariable(static_cast<char**>(cs->Variable), var);
        break;
      case CommandLineArguments::STL_STRING_TYPE:
        this->PopulateVariable(static_cast<std::string*>(cs->Variable), var);
        break;
      case CommandLineArguments::BOOL_TYPE:
        this->PopulateVariable(static_cast<bool*>(cs->Variable), var);
        break;
      case CommandLineArguments::VECTOR_BOOL_TYPE:
        this->PopulateVariable(static_cast<std::vector<bool>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_INT_TYPE:
        this->PopulateVariable(static_cast<std::vector<int>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_DOUBLE_TYPE:
        this->PopulateVariable(static_cast<std::vector<double>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_STRING_TYPE:
        this->PopulateVariable(static_cast<std::vector<char*>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_STL_STRING_TYPE:
        this->PopulateVariable(
          static_cast<std::vector<std::string>*>(cs->Variable), var);
        break;
      default:
        std::cerr << "Got unknown variable type: \"" << cs->VariableType
                  << "\"" << std::endl;
        this->Internals->LastArgument--;
        return false;
    }
  }
  return true;
}